

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::CheckCompress
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  int iVar1;
  int64_t iVar2;
  long in_RDI;
  double nfreerate;
  TPZFrontSym<double> *in_stack_00000140;
  
  iVar2 = TPZFrontSym<double>::NFree((TPZFrontSym<double> *)0x1cd92ff);
  iVar1 = TPZFront<double>::FrontSize((TPZFront<double> *)(in_RDI + 0x1f9e8));
  if (20.0 < ((double)iVar2 / (double)iVar1) * 100.0) {
    TPZFrontSym<double>::Compress(in_stack_00000140);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::CheckCompress()
{
	double nfreerate = ( (double)fFront.NFree() / (double)fFront.FrontSize() ) * 100;
	if(nfreerate>20.) 
	{
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Compressing front nfreerate " << nfreerate << " NFree " << fFront.NFree() << " Front elements " << fFront.FrontSize();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		fFront.Compress();
#ifdef PZ_LOG
        if (loggerfw.isInfoEnabled())
		{
			std::stringstream sout;
			sout << "Frondwidth after Compress "<< fFront.FrontSize();
			LOGPZ_INFO(loggerfw,sout.str())
		}
#endif
	}
}